

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void mf_print_offset_features(gdmf *d,example *ec,size_t offset)

{
  parameters *this;
  float *pfVar1;
  float fVar2;
  byte bVar3;
  vw *pvVar4;
  byte *pbVar5;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  float *pfVar8;
  float *pfVar9;
  unsigned_long *puVar10;
  pointer pbVar11;
  ostream *poVar12;
  weight *pwVar13;
  byte *pbVar14;
  float *pfVar15;
  vw_exception *this_00;
  long lVar16;
  ulong uVar17;
  pointer pbVar18;
  long lVar19;
  size_t *local_270;
  float *local_260;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_210;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  pvVar4 = d->all;
  this = &pvVar4->weights;
  pbVar5 = (ec->super_example_predict).indices._end;
  for (pbVar14 = (ec->super_example_predict).indices._begin; pbVar14 != pbVar5;
      pbVar14 = pbVar14 + 1) {
    bVar3 = *pbVar14;
    psVar6 = (ec->super_example_predict).feature_space[bVar3].space_names._begin;
    psVar7 = (ec->super_example_predict).feature_space[bVar3].space_names._end;
    pfVar8 = (ec->super_example_predict).feature_space[bVar3].values._begin;
    pfVar9 = (ec->super_example_predict).feature_space[bVar3].values._end;
    puVar10 = (ec->super_example_predict).feature_space[bVar3].indicies._begin;
    for (lVar19 = 0; pfVar1 = (float *)((long)pfVar8 + lVar19), pfVar1 != pfVar9;
        lVar19 = lVar19 + 4) {
      std::operator<<((ostream *)&std::cout,'\t');
      if (psVar6 != psVar7) {
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  *(string **)
                                   ((long)&(psVar6->
                                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + lVar19 * 4));
        poVar12 = std::operator<<(poVar12,'^');
        poVar12 = std::operator<<(poVar12,(string *)
                                          (*(long *)((long)&(psVar6->
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar19 * 4) + 0x20));
        std::operator<<(poVar12,':');
      }
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar12 = std::operator<<(poVar12,"(");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12,")");
      poVar12 = std::operator<<(poVar12,':');
      std::ostream::operator<<(poVar12,*pfVar1);
      poVar12 = std::operator<<((ostream *)&std::cout,':');
      pwVar13 = parameters::operator[](this,*(size_t *)((long)puVar10 + lVar19 * 2));
      std::ostream::operator<<(poVar12,pwVar13[offset]);
    }
  }
  pbVar11 = (pvVar4->pairs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar18 = (pvVar4->pairs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar11;
      pbVar18 = pbVar18 + 1) {
    pbVar14 = (byte *)(pbVar18->_M_dataplus)._M_p;
    bVar3 = *pbVar14;
    if (((ec->super_example_predict).feature_space[bVar3].values._end !=
         (ec->super_example_predict).feature_space[bVar3].values._begin) &&
       (bVar3 = pbVar14[1],
       (ec->super_example_predict).feature_space[bVar3].values._end !=
       (ec->super_example_predict).feature_space[bVar3].values._begin)) {
      for (uVar17 = 1; uVar17 <= d->rank; uVar17 = uVar17 + 1) {
        bVar3 = *(pbVar18->_M_dataplus)._M_p;
        pfVar8 = (ec->super_example_predict).feature_space[bVar3].values._end;
        local_270 = (ec->super_example_predict).feature_space[bVar3].indicies._begin;
        local_210 = (ec->super_example_predict).feature_space[bVar3].space_names._begin;
        lVar19 = offset + uVar17;
        for (local_260 = (ec->super_example_predict).feature_space[bVar3].values._begin;
            local_260 != pfVar8; local_260 = local_260 + 1) {
          bVar3 = (pbVar18->_M_dataplus)._M_p[1];
          pfVar9 = (ec->super_example_predict).feature_space[bVar3].values._begin;
          pfVar1 = (ec->super_example_predict).feature_space[bVar3].values._end;
          puVar10 = (ec->super_example_predict).feature_space[bVar3].indicies._begin;
          psVar6 = (ec->super_example_predict).feature_space[bVar3].space_names._begin;
          for (lVar16 = 0; pfVar15 = (float *)((long)pfVar9 + lVar16), pfVar15 != pfVar1;
              lVar16 = lVar16 + 4) {
            poVar12 = std::operator<<((ostream *)&std::cout,'\t');
            poVar12 = std::operator<<(poVar12,(string *)
                                              (local_210->
                                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,'^');
            poVar12 = std::operator<<(poVar12,(string *)
                                              &((local_210->
                                                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->second);
            poVar12 = std::operator<<(poVar12,':');
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,")");
            poVar12 = std::operator<<(poVar12,':');
            std::ostream::operator<<(poVar12,*local_260);
            poVar12 = std::operator<<((ostream *)&std::cout,':');
            pwVar13 = parameters::operator[](this,*local_270);
            std::ostream::operator<<(poVar12,pwVar13[lVar19]);
            poVar12 = std::operator<<((ostream *)&std::cout,':');
            poVar12 = std::operator<<(poVar12,*(string **)
                                               ((long)&(psVar6->
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar16 * 4));
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,'^');
            poVar12 = std::operator<<(poVar12,(string *)
                                              (*(long *)((long)&(psVar6->
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar16 * 4) + 0x20));
            poVar12 = std::operator<<(poVar12,':');
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            poVar12 = std::operator<<(poVar12,")");
            poVar12 = std::operator<<(poVar12,':');
            std::ostream::operator<<(poVar12,*pfVar15);
            poVar12 = std::operator<<((ostream *)&std::cout,':');
            pwVar13 = parameters::operator[](this,*(size_t *)((long)puVar10 + lVar16 * 2));
            std::ostream::operator<<(poVar12,pwVar13[lVar19 + (ulong)d->rank]);
            poVar12 = std::operator<<((ostream *)&std::cout,':');
            pwVar13 = parameters::operator[](this,*local_270);
            fVar2 = pwVar13[lVar19];
            pwVar13 = parameters::operator[](this,*(size_t *)((long)puVar10 + lVar16 * 2));
            std::ostream::operator<<(poVar12,fVar2 * pwVar13[lVar19 + (ulong)d->rank]);
          }
          local_270 = local_270 + 1;
          local_210 = local_210 + 1;
        }
      }
    }
  }
  if ((pvVar4->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pvVar4->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"cannot use triples in matrix factorization");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
             ,0x4c,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void mf_print_offset_features(gdmf& d, example& ec, size_t offset)
{
  vw& all = *d.all;
  parameters& weights = all.weights;
  uint64_t mask = weights.mask();
  for (features& fs : ec)
  {
    bool audit = !fs.space_names.empty();
    for (auto& f : fs.values_indices_audit())
    {
      cout << '\t';
      if (audit)
        cout << f.audit().get()->first << '^' << f.audit().get()->second << ':';
      cout << f.index() << "(" << ((f.index() + offset) & mask) << ")" << ':' << f.value();
      cout << ':' << (&weights[f.index()])[offset];
    }
  }
  for (string& i : all.pairs)
    if (ec.feature_space[(unsigned char)i[0]].size() > 0 && ec.feature_space[(unsigned char)i[1]].size() > 0)
    {
      /* print out nsk^feature:hash:value:weight:nsk^feature^:hash:value:weight:prod_weights */
      for (size_t k = 1; k <= d.rank; k++)
      {
        for (features::iterator_all& f1 : ec.feature_space[(unsigned char)i[0]].values_indices_audit())
          for (features::iterator_all& f2 : ec.feature_space[(unsigned char)i[1]].values_indices_audit())
          {
            cout << '\t' << f1.audit().get()->first << k << '^' << f1.audit().get()->second << ':'
                 << ((f1.index() + k) & mask) << "(" << ((f1.index() + offset + k) & mask) << ")" << ':' << f1.value();
            cout << ':' << (&weights[f1.index()])[offset + k];

            cout << ':' << f2.audit().get()->first << k << '^' << f2.audit().get()->second << ':'
                 << ((f2.index() + k + d.rank) & mask) << "(" << ((f2.index() + offset + k + d.rank) & mask) << ")"
                 << ':' << f2.value();
            cout << ':' << (&weights[f2.index()])[offset + k + d.rank];

            cout << ':' << (&weights[f1.index()])[offset + k] * (&weights[f2.index()])[offset + k + d.rank];
          }
      }
    }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
  cout << endl;
}